

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t floatx80_to_int64_round_to_zero_mipsel(floatx80 a,float_status *status)

{
  byte bVar1;
  unkuint10 Var2;
  _Bool _Var3;
  flag fVar4;
  int32_t iVar5;
  uint64_t uVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  ulong local_48;
  int64_t z;
  uint64_t aSig;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var2 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var2;
  a_00.high = (short)(Var2 >> 0x40);
  _Var3 = floatx80_invalid_encoding(a_00);
  if (_Var3) {
    float_raise_mipsel('\x01',status);
    a_local.high = 0;
    a_local._10_6_ = 0x800000000000;
  }
  else {
    a_01._10_6_ = 0;
    a_01.low = (long)Var2;
    a_01.high = (short)(Var2 >> 0x40);
    uVar6 = extractFloatx80Frac(a_01);
    a_02._10_6_ = 0;
    a_02.low = (long)Var2;
    a_02.high = (short)(Var2 >> 0x40);
    iVar5 = extractFloatx80Exp(a_02);
    a_03._10_6_ = 0;
    a_03.low = (long)Var2;
    a_03.high = (short)(Var2 >> 0x40);
    fVar4 = extractFloatx80Sign(a_03);
    if (iVar5 + -0x403e < 0) {
      if (iVar5 < 0x3fff) {
        if (iVar5 != 0 || uVar6 != 0) {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
        a_local.high = 0;
        a_local._10_6_ = 0;
      }
      else {
        bVar1 = (byte)(iVar5 + -0x403e);
        local_48 = uVar6 >> (-bVar1 & 0x3f);
        if (uVar6 << (bVar1 & 0x3f) != 0) {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
        if (fVar4 != '\0') {
          local_48 = -local_48;
        }
        a_local._8_8_ = local_48;
      }
    }
    else if (((a.high == 0xc03e) && ((uVar6 & 0x7fffffffffffffff) == 0)) ||
            ((float_raise_mipsel('\x01',status), fVar4 != '\0' &&
             ((iVar5 != 0x7fff || ((uVar6 & 0x7fffffffffffffff) == 0)))))) {
      a_local.high = 0;
      a_local._10_6_ = 0x800000000000;
    }
    else {
      a_local.high = 0xffff;
      a_local._10_6_ = 0x7fffffffffff;
    }
  }
  return a_local._8_8_;
}

Assistant:

int64_t floatx80_to_int64_round_to_zero(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig;
    int64_t z;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1ULL << 63;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    shiftCount = aExp - 0x403E;
    if ( 0 <= shiftCount ) {
        aSig &= UINT64_C(0x7FFFFFFFFFFFFFFF);
        if ( ( a.high != 0xC03E ) || aSig ) {
            float_raise(float_flag_invalid, status);
            if ( ! aSign || ( ( aExp == 0x7FFF ) && aSig ) ) {
                return INT64_MAX;
            }
        }
        return INT64_MIN;
    }
    else if ( aExp < 0x3FFF ) {
        if (aExp | aSig) {
            status->float_exception_flags |= float_flag_inexact;
        }
        return 0;
    }
    z = aSig>>( - shiftCount );
    if ( (uint64_t) ( aSig<<( shiftCount & 63 ) ) ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( aSign ) z = - z;
    return z;

}